

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationBuilder::findOrInsertNodeForPrimary
          (CollationBuilder *this,uint32_t p,UErrorCode *errorCode)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int32_t *piVar4;
  bool bVar5;
  uint uVar6;
  UBool UVar7;
  int elem;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint in_R9D;
  
  elem = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    piVar4 = (this->rootPrimaryIndexes).elements;
    uVar1 = (this->rootPrimaryIndexes).count;
    if (uVar1 == 0) {
      in_R9D = 0xffffffff;
    }
    else {
      uVar9 = 0;
      uVar10 = uVar1;
      do {
        uVar8 = (int)(uVar9 + uVar10) / 2;
        uVar2 = *(uint *)((long)(this->nodes).elements + (long)piVar4[(int)uVar8] * 8 + 4);
        if (uVar2 == p) {
LAB_002270e5:
          bVar5 = false;
          uVar2 = uVar10;
          uVar6 = uVar9;
          in_R9D = uVar8;
        }
        else {
          bVar5 = true;
          if (p < uVar2) {
            uVar2 = uVar8;
            uVar6 = uVar9;
            if (uVar8 == uVar9) {
              uVar8 = ~uVar9;
              goto LAB_002270e5;
            }
          }
          else {
            uVar2 = uVar10;
            uVar6 = uVar8;
            if (uVar8 == uVar9) {
              uVar8 = -uVar9 - 2;
              goto LAB_002270e5;
            }
          }
        }
        uVar9 = uVar6;
        uVar10 = uVar2;
      } while (bVar5);
    }
    if ((int)in_R9D < 0) {
      elem = (this->nodes).count;
      if (((-2 < elem) && (elem < (this->nodes).capacity)) ||
         (UVar7 = UVector64::expandCapacity(&this->nodes,elem + 1,errorCode), UVar7 != '\0')) {
        iVar3 = (this->nodes).count;
        (this->nodes).elements[iVar3] = (ulong)p << 0x20;
        (this->nodes).count = iVar3 + 1;
      }
      UVector32::insertElementAt(&this->rootPrimaryIndexes,elem,~in_R9D,errorCode);
    }
    else {
      elem = 0;
      if ((0 < (int)uVar1) && ((int)in_R9D < (int)uVar1)) {
        elem = piVar4[in_R9D];
      }
    }
  }
  return elem;
}

Assistant:

int32_t
CollationBuilder::findOrInsertNodeForPrimary(uint32_t p, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }

    int32_t rootIndex = binarySearchForRootPrimaryNode(
        rootPrimaryIndexes.getBuffer(), rootPrimaryIndexes.size(), nodes.getBuffer(), p);
    if(rootIndex >= 0) {
        return rootPrimaryIndexes.elementAti(rootIndex);
    } else {
        // Start a new list of nodes with this primary.
        int32_t index = nodes.size();
        nodes.addElement(nodeFromWeight32(p), errorCode);
        rootPrimaryIndexes.insertElementAt(index, ~rootIndex, errorCode);
        return index;
    }
}